

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::resize(Value *this,ArrayIndex newSize)

{
  ArrayIndex AVar1;
  uint in_ESI;
  undefined8 *in_RDI;
  ArrayIndex index;
  ArrayIndex oldSize;
  ArrayIndex in_stack_00000054;
  Value *in_stack_00000058;
  ostringstream oss;
  Value *in_stack_fffffffffffffdd8;
  Value *in_stack_fffffffffffffde0;
  CZString *this_00;
  undefined8 in_stack_fffffffffffffde8;
  string *in_stack_fffffffffffffdf0;
  Value *in_stack_fffffffffffffdf8;
  ostringstream *this_01;
  Value *in_stack_fffffffffffffe10;
  ArrayIndex local_1e8;
  Value local_1e0;
  string local_1b8 [48];
  ostringstream local_188 [280];
  Value *in_stack_ffffffffffffff90;
  
  if (((*(ushort *)(in_RDI + 1) & 0xff) != 0) && ((*(ushort *)(in_RDI + 1) & 0xff) != 6)) {
    this_01 = local_188;
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::operator<<((ostream *)this_01,"in Json::Value::resize(): requires arrayValue");
    std::__cxx11::ostringstream::str();
    throwLogicError(in_stack_fffffffffffffdf0);
    std::__cxx11::string::~string(local_1b8);
    abort();
  }
  if ((*(ushort *)(in_RDI + 1) & 0xff) == 0) {
    Value(&local_1e0,(ValueType)((ulong)in_stack_fffffffffffffde8 >> 0x20));
    operator=(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    ~Value(in_stack_fffffffffffffe10);
  }
  AVar1 = size(in_stack_fffffffffffffdf8);
  if (in_ESI == 0) {
    clear(in_stack_ffffffffffffff90);
  }
  else {
    local_1e8 = in_ESI;
    if (AVar1 < in_ESI) {
      operator[](in_stack_00000058,in_stack_00000054);
    }
    else {
      for (; local_1e8 < AVar1; local_1e8 = local_1e8 + 1) {
        this_00 = (CZString *)*in_RDI;
        CZString::CZString((CZString *)&stack0xfffffffffffffe08,local_1e8);
        std::
        map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::erase((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                 *)this_00,(key_type *)in_stack_fffffffffffffdd8);
        CZString::~CZString(this_00);
      }
      AVar1 = size(in_stack_fffffffffffffdf8);
      if (AVar1 != in_ESI) {
        __assert_fail("size() == newSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/lib_json/json_value.cpp"
                      ,0x394,"void Json::Value::resize(ArrayIndex)");
      }
    }
  }
  return;
}

Assistant:

void Value::resize(ArrayIndex newSize) {
  JSON_ASSERT_MESSAGE(type_ == nullValue || type_ == arrayValue,
                      "in Json::Value::resize(): requires arrayValue");
  if (type_ == nullValue)
    *this = Value(arrayValue);
  ArrayIndex oldSize = size();
  if (newSize == 0)
    clear();
  else if (newSize > oldSize)
    (*this)[newSize - 1];
  else {
    for (ArrayIndex index = newSize; index < oldSize; ++index) {
      value_.map_->erase(index);
    }
    assert(size() == newSize);
  }
}